

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LdConfigDirWrapper.cpp
# Opt level: O1

bool __thiscall
LdConfigDirWrapper::wrapSubentriesTable
          (LdConfigDirWrapper *this,size_t parentFieldId,size_t counterFieldId)

{
  int iVar1;
  undefined4 extraout_var;
  LdConfigEntryWrapper *this_00;
  void *pvVar2;
  vector<ExeNodeWrapper*,std::allocator<ExeNodeWrapper*>> *this_01;
  size_t entryNumber;
  bool bVar3;
  bool isOk;
  char local_5d;
  key_type_conflict2 local_5c;
  LdConfigEntryWrapper *local_58;
  LdConfigDirWrapper *local_50;
  map<unsigned_int,_std::vector<ExeNodeWrapper_*,_std::allocator<ExeNodeWrapper_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<ExeNodeWrapper_*,_std::allocator<ExeNodeWrapper_*>_>_>_>_>
  *local_48;
  vector<ExeNodeWrapper*,std::allocator<ExeNodeWrapper*>> *local_40;
  _func_int **local_38;
  
  local_5d = '\0';
  iVar1 = (*(this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
            super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0x1c])
                    (this,counterFieldId,0xffffffffffffffff,&local_5d);
  if (local_5d == '\x01') {
    if (CONCAT44(extraout_var,iVar1) != 0) {
      local_40 = (vector<ExeNodeWrapper*,std::allocator<ExeNodeWrapper*>> *)
                 &(this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.entries
      ;
      local_48 = &this->subEntriesMap;
      local_38 = (_func_int **)&PTR__ExeNodeWrapper_00158110;
      entryNumber = 0;
      local_50 = this;
      do {
        this_00 = (LdConfigEntryWrapper *)operator_new(0x48);
        ExeNodeWrapper::ExeNodeWrapper
                  ((ExeNodeWrapper *)this_00,
                   (this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
                   super_ExeElementWrapper.m_Exe,(ExeNodeWrapper *)this,entryNumber);
        (this_00->super_ExeNodeWrapper).super_ExeElementWrapper.super_AbstractByteBuffer.
        _vptr_AbstractByteBuffer = local_38;
        this_00->parentFieldId = parentFieldId;
        this_00->parentDir = this;
        pvVar2 = LdConfigEntryWrapper::getPtr(this_00);
        if (pvVar2 == (void *)0x0) {
          (*(this_00->super_ExeNodeWrapper).super_ExeElementWrapper.super_AbstractByteBuffer.
            _vptr_AbstractByteBuffer[1])(this_00);
          return (bool)local_5d;
        }
        local_58 = this_00;
        std::vector<ExeNodeWrapper*,std::allocator<ExeNodeWrapper*>>::emplace_back<ExeNodeWrapper*>
                  (local_40,(ExeNodeWrapper **)&local_58);
        local_5c = (key_type_conflict2)parentFieldId;
        this_01 = (vector<ExeNodeWrapper*,std::allocator<ExeNodeWrapper*>> *)
                  std::
                  map<unsigned_int,_std::vector<ExeNodeWrapper_*,_std::allocator<ExeNodeWrapper_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<ExeNodeWrapper_*,_std::allocator<ExeNodeWrapper_*>_>_>_>_>
                  ::operator[](local_48,&local_5c);
        this = local_50;
        local_58 = this_00;
        std::vector<ExeNodeWrapper*,std::allocator<ExeNodeWrapper*>>::emplace_back<ExeNodeWrapper*>
                  (this_01,(ExeNodeWrapper **)&local_58);
        bVar3 = CONCAT44(extraout_var,iVar1) - 1U != entryNumber;
        entryNumber = entryNumber + 1;
      } while (bVar3);
    }
  }
  else {
    local_5d = '\0';
  }
  return (bool)local_5d;
}

Assistant:

bool LdConfigDirWrapper::wrapSubentriesTable(size_t parentFieldId, size_t counterFieldId)
{
    bool isOk = false;
    size_t count = this->getNumValue(counterFieldId, &isOk);
    if (!isOk) {
        return false;
    }
    for (size_t i = 0 ; i < count; i++) {
        LdConfigEntryWrapper *entry = new LdConfigEntryWrapper(m_Exe, this, i, parentFieldId);
        if (!entry || !entry->getPtr()) {
            delete entry;
            break;
        }
        this->entries.push_back(entry);
        this->subEntriesMap[parentFieldId].push_back(entry);
    }
    return isOk;
}